

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O2

void dumpTokenArray(KonohaContext *kctx,int nest,kArray *a,int s,int e)

{
  kToken *tk;
  _func_int_char_ptr_varargs *p_Var1;
  undefined8 uVar2;
  long lVar3;
  
  if (verbose_sugar != 0) {
    if (nest == 0) {
      (*kctx->platApi->printf_i)(">>>\n");
    }
    for (lVar3 = (long)s; lVar3 < e; lVar3 = lVar3 + 1) {
      tk = (kToken *)(a->field_2).unboxItems[lVar3];
      dumpIndent(kctx,nest);
      dumpToken(kctx,tk,(int)lVar3);
      if (((((tk->field_2).text)->h).ct)->baseTypeId == 6) {
        dumpIndent(kctx,nest);
        p_Var1 = kctx->platApi->printf_i;
        uVar2 = (**(code **)(*(long *)(*(long *)(*(long *)(((tk->field_2).text)->field_2).byteptr +
                                                0x20) + 8) + 0x20))(kctx);
        (*p_Var1)("%s\n",uVar2);
        dumpTokenArray(kctx,nest + 1,(tk->field_2).GroupTokenList,1,
                       (int)(((tk->field_2).GroupTokenList)->bytesize >> 3) + -1);
        dumpIndent(kctx,nest);
        p_Var1 = kctx->platApi->printf_i;
        uVar2 = (**(code **)(*(long *)(*(long *)(*(long *)((((tk->field_2).text)->field_2).byteptr +
                                                          ((((tk->field_2).text)->bytesize &
                                                           0xfffffffffffffff8) - 8)) + 0x20) + 8) +
                            0x20))(kctx);
        (*p_Var1)("%s\n",uVar2);
      }
    }
    if (nest == 0) {
      (*kctx->platApi->printf_i)("<<<\n");
      return;
    }
  }
  return;
}

Assistant:

static void dumpTokenArray(KonohaContext *kctx, int nest, kArray *a, int s, int e)
{
	if(verbose_sugar) {
		if(nest == 0) DUMP_P(">>>\n");
		while(s < e) {
			kToken *tk = a->TokenItems[s];
			dumpIndent(kctx, nest);
			dumpToken(kctx, tk, s);
			if(IS_Array(tk->GroupTokenList)) {
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[0]->text));
				dumpTokenArray(kctx, nest+1, RangeGroup(tk->GroupTokenList));
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[kArray_size(tk->GroupTokenList)-1]->text));
			}
			s++;
		}
		if(nest == 0) DUMP_P("<<<\n");
	}
}